

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_image.cpp
# Opt level: O3

void load_image_block(astcenc_profile decode_mode,astcenc_image *img,image_block *blk,
                     block_size_descriptor *bsd,uint xpos,uint ypos,uint zpos,astcenc_swizzle *swz)

{
  uint uVar1;
  void *pvVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  byte bVar6;
  uint uVar7;
  int iVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  code *pcVar13;
  byte bVar14;
  uint uVar15;
  code *pcVar16;
  code *pcVar17;
  undefined8 uVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  bool bVar22;
  undefined8 uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 extraout_var [56];
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined8 local_118;
  undefined1 local_88 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  
  uVar1 = img->dim_x;
  uVar10 = img->dim_y;
  uVar20 = img->dim_z;
  blk->xpos = xpos;
  blk->ypos = ypos;
  blk->zpos = zpos;
  pcVar17 = swz_texel;
  if ((swz->a == ASTCENC_SWZ_A && swz->b == ASTCENC_SWZ_B) &&
      (swz->g == ASTCENC_SWZ_G && swz->r == ASTCENC_SWZ_R)) {
    pcVar17 = swz_texel_skip;
  }
  auVar35 = vpinsrd_avx(ZEXT416(decode_mode & ~ASTCENC_PRF_LDR),decode_mode,1);
  auVar35 = vpcmpeqd_avx(auVar35,_DAT_00326bd0);
  auVar5 = vpshufd_avx(auVar35,0x40);
  pcVar13 = load_texel_u8;
  if (img->data_type == ASTCENC_TYPE_F32) {
    pcVar13 = load_texel_f32;
  }
  pcVar16 = load_texel_f16;
  if (img->data_type != ASTCENC_TYPE_F16) {
    pcVar16 = pcVar13;
  }
  pcVar13 = encode_texel_lns;
  if ((((auVar5 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar5 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar5 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar5[0xf]) {
    pcVar13 = encode_texel_unorm;
  }
  bVar9 = bsd->zdim;
  local_88 = ZEXT816(0);
  if (bVar9 == 0) {
    auVar24._8_4_ = 0x7e967699;
    auVar24._0_8_ = 0x7e9676997e967699;
    auVar24._12_4_ = 0x7e967699;
    auVar40._8_4_ = 0xfe967699;
    auVar40._0_8_ = 0xfe967699fe967699;
    auVar40._12_4_ = 0xfe967699;
    bVar22 = true;
    auVar27 = ZEXT816(0);
  }
  else {
    fVar26 = 1.0 / (float)bsd->texel_count;
    auVar40 = vpmovsxdq_avx(auVar35);
    auVar25 = ZEXT1664(auVar40);
    uVar18 = vpextrq_avx(auVar40,1);
    uVar20 = uVar20 - 1;
    uVar10 = uVar10 - 1;
    uVar21 = uVar1 - 1;
    bVar6 = bsd->ydim;
    auVar40 = vpcmpeqd_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26));
    auVar31 = ZEXT1664(auVar40);
    auVar41 = ZEXT1664(CONCAT412(0xfe967699,CONCAT48(0xfe967699,0xfe967699fe967699)));
    auVar43 = ZEXT864(0);
    auVar42 = ZEXT1664(CONCAT412(0x7e967699,CONCAT48(0x7e967699,0x7e9676997e967699)));
    iVar8 = 0;
    uVar12 = 0;
    bVar14 = bVar6;
    do {
      uVar7 = zpos + uVar12;
      if (uVar20 <= zpos + uVar12) {
        uVar7 = uVar20;
      }
      uVar15 = 0;
      if (bVar14 == 0) {
        bVar14 = 0;
      }
      else {
        pvVar2 = img->data[uVar7];
        bVar9 = bsd->xdim;
        do {
          if (bVar9 == 0) {
            bVar9 = 0;
          }
          else {
            uVar7 = ypos + uVar15;
            if (uVar10 <= ypos + uVar15) {
              uVar7 = uVar10;
            }
            lVar19 = 0;
            do {
              uVar11 = xpos + (int)lVar19;
              if (uVar21 <= uVar11) {
                uVar11 = uVar21;
              }
              (*pcVar16)(pvVar2,(uVar11 + uVar7 * uVar1) * 4);
              uVar23 = (*pcVar17)(swz);
              local_118 = auVar5._0_8_;
              auVar25._0_8_ = (*pcVar13)(uVar23,local_118);
              auVar25._8_56_ = extraout_var;
              local_68 = auVar43._0_4_;
              fStack_64 = auVar43._4_4_;
              fStack_60 = auVar43._8_4_;
              fStack_5c = auVar43._12_4_;
              auVar24 = auVar25._0_16_;
              auVar40 = vminps_avx(auVar42._0_16_,auVar24);
              auVar42 = ZEXT1664(auVar40);
              fVar3 = (float)auVar25._0_8_;
              auVar43 = ZEXT1664(CONCAT412(fStack_5c + fVar26 * extraout_var._4_4_,
                                           CONCAT48(fStack_60 + fVar26 * extraout_var._0_4_,
                                                    CONCAT44(fStack_64 +
                                                             fVar26 * (float)((ulong)auVar25._0_8_
                                                                             >> 0x20),
                                                             local_68 + fVar26 * fVar3))));
              auVar40 = vmaxps_avx(auVar41._0_16_,auVar24);
              auVar41 = ZEXT1664(auVar40);
              auVar27._4_4_ = fVar3;
              auVar27._0_4_ = fVar3;
              auVar27._8_4_ = fVar3;
              auVar27._12_4_ = fVar3;
              auVar40 = vshufps_avx(auVar24,auVar24,0xa5);
              auVar40 = vcmpps_avx(auVar27,auVar40,0);
              blk->data_r[iVar8 + lVar19] = fVar3;
              fVar3 = (float)vextractps_avx(auVar24,1);
              blk->data_g[iVar8 + lVar19] = fVar3;
              auVar40 = vandps_avx(auVar40,auVar31._0_16_);
              auVar31 = ZEXT1664(auVar40);
              fVar3 = (float)vextractps_avx(auVar24,2);
              blk->data_b[iVar8 + lVar19] = fVar3;
              fVar3 = (float)vextractps_avx(auVar24,3);
              blk->data_a[iVar8 + lVar19] = fVar3;
              blk->rgb_lns[lVar19 + iVar8] = auVar35[0] & 1;
              blk->alpha_lns[lVar19 + iVar8] = (byte)uVar18 & 1;
              bVar9 = bsd->xdim;
              lVar19 = lVar19 + 1;
            } while ((uint)lVar19 < (uint)bVar9);
            iVar8 = iVar8 + (uint)lVar19;
            bVar6 = bsd->ydim;
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 < bVar6);
        bVar9 = bsd->zdim;
        bVar14 = bVar6;
      }
      auVar40 = auVar41._0_16_;
      auVar27 = auVar43._0_16_;
      auVar24 = auVar42._0_16_;
      uVar12 = uVar12 + 1;
    } while (uVar12 < bVar9);
    auVar4 = vpcmpeqd_avx(auVar25._0_16_,auVar25._0_16_);
    auVar4 = auVar4 & ~auVar31._0_16_;
    bVar22 = (((auVar4 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
              (auVar4 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar4 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar4[0xf];
  }
  auVar4 = vinsertps_avx(*(undefined1 (*) [16])blk->data_r,ZEXT416((uint)blk->data_g[0]),0x10);
  auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)blk->data_b[0]),0x20);
  auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)blk->data_a[0]),0x30);
  if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    auVar28._0_4_ = (int)auVar4._0_4_;
    auVar28._4_4_ = (int)auVar4._4_4_;
    auVar28._8_4_ = (int)auVar4._8_4_;
    auVar28._12_4_ = (int)auVar4._12_4_;
    auVar35._8_4_ = 0x7ff;
    auVar35._0_8_ = 0x7ff000007ff;
    auVar35._12_4_ = 0x7ff;
    auVar29 = vpand_avx(auVar28,auVar35);
    auVar32._8_4_ = 3;
    auVar32._0_8_ = 0x300000003;
    auVar32._12_4_ = 3;
    auVar30 = vpmaddwd_avx(auVar29,auVar32);
    auVar34._8_4_ = 0x1ff;
    auVar34._0_8_ = 0x1ff000001ff;
    auVar34._12_4_ = 0x1ff;
    auVar32 = vpcmpgtd_avx(auVar29,auVar34);
    auVar35 = vpslld_avx(auVar29,2);
    auVar36._8_4_ = 0xfffffe00;
    auVar36._0_8_ = 0xfffffe00fffffe00;
    auVar36._12_4_ = 0xfffffe00;
    auVar37._8_4_ = 0x5ff;
    auVar37._0_8_ = 0x5ff000005ff;
    auVar37._12_4_ = 0x5ff;
    auVar35 = vpaddd_avx(auVar35,auVar36);
    auVar33 = vpcmpgtd_avx(auVar29,auVar37);
    auVar38._8_2_ = 5;
    auVar38._0_8_ = 0x5000500050005;
    auVar38._10_2_ = 5;
    auVar38._12_2_ = 5;
    auVar38._14_2_ = 5;
    auVar29 = vpmaddwd_avx(auVar29,auVar38);
    auVar39._8_4_ = 0xfffff800;
    auVar39._0_8_ = 0xfffff800fffff800;
    auVar39._12_4_ = 0xfffff800;
    auVar29 = vpaddd_avx(auVar29,auVar39);
    auVar35 = vblendvps_avx(auVar35,auVar29,auVar33);
    auVar35 = vblendvps_avx(auVar30,auVar35,auVar32);
    auVar29 = vpsrld_avx(auVar28,1);
    auVar33._8_4_ = 0x7ffffc00;
    auVar33._0_8_ = 0x7ffffc007ffffc00;
    auVar33._12_4_ = 0x7ffffc00;
    auVar32 = vpsrld_avx(auVar35,3);
    auVar35 = vpand_avx(auVar29,auVar33);
    auVar29._8_4_ = 0x7bff;
    auVar29._0_8_ = 0x7bff00007bff;
    auVar29._12_4_ = 0x7bff;
    auVar35 = vpor_avx(auVar32,auVar35);
    auVar35 = vpminud_avx(auVar35,auVar29);
    auVar35 = vpackssdw_avx(auVar35,auVar35);
    local_88 = vcvtph2ps_f16c(auVar35);
  }
  auVar30._8_4_ = 0x477fff00;
  auVar30._0_8_ = 0x477fff00477fff00;
  auVar30._12_4_ = 0x477fff00;
  auVar35 = vdivps_avx(auVar4,auVar30);
  auVar35 = vblendvps_avx(auVar35,local_88,auVar5);
  *(undefined1 (*) [16])(blk->origin_texel).m = auVar35;
  *(undefined1 (*) [16])(blk->data_min).m = auVar24;
  *(undefined1 (*) [16])(blk->data_mean).m = auVar27;
  *(undefined1 (*) [16])(blk->data_max).m = auVar40;
  blk->grayscale = bVar22;
  return;
}

Assistant:

void load_image_block(
	astcenc_profile decode_mode,
	const astcenc_image& img,
	image_block& blk,
	const block_size_descriptor& bsd,
	unsigned int xpos,
	unsigned int ypos,
	unsigned int zpos,
	const astcenc_swizzle& swz
) {
	unsigned int xsize = img.dim_x;
	unsigned int ysize = img.dim_y;
	unsigned int zsize = img.dim_z;

	blk.xpos = xpos;
	blk.ypos = ypos;
	blk.zpos = zpos;

	// True if any non-identity swizzle
	bool needs_swz = (swz.r != ASTCENC_SWZ_R) || (swz.g != ASTCENC_SWZ_G) ||
	                 (swz.b != ASTCENC_SWZ_B) || (swz.a != ASTCENC_SWZ_A);

	int idx = 0;

	vfloat4 data_min(1e38f);
	vfloat4 data_mean(0.0f);
	vfloat4 data_mean_scale(1.0f / static_cast<float>(bsd.texel_count));
	vfloat4 data_max(-1e38f);
	vmask4 grayscalev(true);

	// This works because we impose the same choice everywhere during encode
	uint8_t rgb_lns = (decode_mode == ASTCENC_PRF_HDR) ||
	                  (decode_mode == ASTCENC_PRF_HDR_RGB_LDR_A) ? 1 : 0;
	uint8_t a_lns = decode_mode == ASTCENC_PRF_HDR ? 1 : 0;
	vint4 use_lns(rgb_lns, rgb_lns, rgb_lns, a_lns);
	vmask4 lns_mask = use_lns != vint4::zero();

	// Set up the function pointers for loading pipeline as needed
	pixel_loader loader = load_texel_u8;
	if (img.data_type == ASTCENC_TYPE_F16)
	{
		loader = load_texel_f16;
	}
	else if  (img.data_type == ASTCENC_TYPE_F32)
	{
		loader = load_texel_f32;
	}

	pixel_swizzler swizzler = swz_texel_skip;
	if (needs_swz)
	{
		swizzler = swz_texel;
	}

	pixel_converter converter = encode_texel_unorm;
	if (any(lns_mask))
	{
		converter = encode_texel_lns;
	}

	for (unsigned int z = 0; z < bsd.zdim; z++)
	{
		unsigned int zi = astc::min(zpos + z, zsize - 1);
		void* plane = img.data[zi];

		for (unsigned int y = 0; y < bsd.ydim; y++)
		{
			unsigned int yi = astc::min(ypos + y, ysize - 1);

			for (unsigned int x = 0; x < bsd.xdim; x++)
			{
				unsigned int xi = astc::min(xpos + x, xsize - 1);

				vfloat4 datav = loader(plane, (4 * xsize * yi) + (4 * xi));
				datav = swizzler(datav, swz);
				datav = converter(datav, lns_mask);

				// Compute block metadata
				data_min = min(data_min, datav);
				data_mean += datav * data_mean_scale;
				data_max = max(data_max, datav);

				grayscalev = grayscalev & (datav.swz<0,0,0,0>() == datav.swz<1,1,2,2>());

				blk.data_r[idx] = datav.lane<0>();
				blk.data_g[idx] = datav.lane<1>();
				blk.data_b[idx] = datav.lane<2>();
				blk.data_a[idx] = datav.lane<3>();

				blk.rgb_lns[idx] = rgb_lns;
				blk.alpha_lns[idx] = a_lns;

				idx++;
			}
		}
	}

	// Reverse the encoding so we store origin block in the original format
	vfloat4 data_enc = blk.texel(0);
	vfloat4 data_enc_unorm = data_enc / 65535.0f;
	vfloat4 data_enc_lns = vfloat4::zero();

	if (rgb_lns || a_lns)
	{
		data_enc_lns = float16_to_float(lns_to_sf16(float_to_int(data_enc)));
	}

	blk.origin_texel = select(data_enc_unorm, data_enc_lns, lns_mask);

	// Store block metadata
	blk.data_min = data_min;
	blk.data_mean = data_mean;
	blk.data_max = data_max;
	blk.grayscale = all(grayscalev);
}